

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O1

Ivy_Man_t * Ivy_ManStart(void)

{
  uint uVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Man_t *p;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  int *__s;
  int iVar5;
  
  p = (Ivy_Man_t *)malloc(0x110);
  memset(p,0,0x110);
  (p->Ghost).Id = -1;
  p->fCatchExor = 1;
  p->nTravIds = 1;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  p->vPis = pVVar3;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  p->vPos = pVVar3;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  p->vBufs = pVVar3;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  p->vObjs = pVVar3;
  Ivy_ManStartMemory(p);
  if (p->pListFree == (Ivy_Obj_t *)0x0) {
    Ivy_ManAddMemory(p);
  }
  pIVar2 = p->pListFree;
  p->pListFree = *(Ivy_Obj_t **)pIVar2;
  pIVar2->pPrevFan1 = (Ivy_Obj_t *)0x0;
  pIVar2->pEquiv = (Ivy_Obj_t *)0x0;
  pIVar2->pNextFan1 = (Ivy_Obj_t *)0x0;
  pIVar2->pPrevFan0 = (Ivy_Obj_t *)0x0;
  pIVar2->pFanout = (Ivy_Obj_t *)0x0;
  pIVar2->pNextFan0 = (Ivy_Obj_t *)0x0;
  pIVar2->pFanin0 = (Ivy_Obj_t *)0x0;
  pIVar2->pFanin1 = (Ivy_Obj_t *)0x0;
  pIVar2->Id = 0;
  pIVar2->TravId = 0;
  *(undefined8 *)&pIVar2->field_0x8 = 0;
  p->pConst1 = pIVar2;
  pIVar2->field_0x8 = pIVar2->field_0x8 | 0x80;
  pVVar3 = p->vObjs;
  pIVar2 = p->pConst1;
  uVar1 = pVVar3->nCap;
  if (pVVar3->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar4;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_0079feb5;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar4;
    }
    pVVar3->nCap = iVar5;
  }
LAB_0079feb5:
  iVar5 = pVVar3->nSize;
  pVVar3->nSize = iVar5 + 1;
  pVVar3->pArray[iVar5] = pIVar2;
  p->nCreated = 1;
  p->nTableSize = 0x2717;
  __s = (int *)malloc(0x9c5c);
  p->pTable = __s;
  memset(__s,0,0x9c5c);
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ivy_Man_t * Ivy_ManStart()
{
    Ivy_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Ivy_Man_t, 1 );
    memset( p, 0, sizeof(Ivy_Man_t) );
    // perform initializations
    p->Ghost.Id   = -1;
    p->nTravIds   =  1;
    p->fCatchExor =  1;
    // allocate arrays for nodes
    p->vPis = Vec_PtrAlloc( 100 );
    p->vPos = Vec_PtrAlloc( 100 );
    p->vBufs = Vec_PtrAlloc( 100 );
    p->vObjs = Vec_PtrAlloc( 100 );
    // prepare the internal memory manager
    Ivy_ManStartMemory( p );
    // create the constant node
    p->pConst1 = Ivy_ManFetchMemory( p );
    p->pConst1->fPhase = 1;
    Vec_PtrPush( p->vObjs, p->pConst1 );
    p->nCreated = 1;
    // start the table
    p->nTableSize = 10007;
    p->pTable = ABC_ALLOC( int, p->nTableSize );
    memset( p->pTable, 0, sizeof(int) * p->nTableSize );
    return p;
}